

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<4,_16777232,_true,_embree::avx2::SubGridMBIntersector1Pluecker<4,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  AABBNodeMB4D *node1;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  RTCIntersectArguments *pRVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  Geometry *pGVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  float fVar47;
  float fVar48;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar46 [32];
  undefined4 uVar53;
  vint4 ai;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  vint4 bi;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  vint4 ai_1;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  vint4 bi_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  vint4 bi_7;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  float fVar124;
  undefined1 auVar120 [32];
  float fVar122;
  float fVar123;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar121 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  float fVar137;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar142 [32];
  float fVar152;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar156 [64];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  float fVar168;
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [64];
  UVIdentity<8> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  vint4 bi_5;
  vint4 bi_2;
  NodeRef stack [244];
  undefined1 local_d31;
  Ray *local_d30;
  RayQueryContext *local_d28;
  uint local_d1c;
  uint local_d18;
  int local_d14;
  Scene *local_d10;
  ulong local_d08;
  undefined1 local_d00 [32];
  undefined1 local_ce0 [48];
  ulong local_cb0;
  ulong local_ca8;
  ulong local_ca0;
  long local_c98;
  long local_c90;
  long local_c88;
  ulong *local_c80;
  ulong local_c78;
  long local_c70;
  long local_c68;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined4 local_c0c;
  undefined4 local_c08;
  uint local_c04;
  uint local_c00;
  RTCFilterFunctionNArguments local_bf0;
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [48];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  float local_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined1 local_9a0 [32];
  undefined4 local_980;
  undefined4 uStack_97c;
  undefined4 uStack_978;
  undefined4 uStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 uStack_968;
  undefined4 uStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 *local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  ulong local_800;
  ulong local_7f8 [249];
  
  local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_800 != 8) && (fVar143 = ray->tfar, 0.0 <= fVar143)) {
    local_c80 = local_7f8;
    auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    aVar1 = (ray->dir).field_0;
    auVar42._8_4_ = 0x7fffffff;
    auVar42._0_8_ = 0x7fffffff7fffffff;
    auVar42._12_4_ = 0x7fffffff;
    auVar42 = vandps_avx((undefined1  [16])aVar1,auVar42);
    auVar80._8_4_ = 0x219392ef;
    auVar80._0_8_ = 0x219392ef219392ef;
    auVar80._12_4_ = 0x219392ef;
    auVar42 = vcmpps_avx(auVar42,auVar80,1);
    auVar81._8_4_ = 0x3f800000;
    auVar81._0_8_ = 0x3f8000003f800000;
    auVar81._12_4_ = 0x3f800000;
    auVar80 = vdivps_avx(auVar81,(undefined1  [16])aVar1);
    auVar82._8_4_ = 0x5d5e0b6b;
    auVar82._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar82._12_4_ = 0x5d5e0b6b;
    auVar42 = vblendvps_avx(auVar80,auVar82,auVar42);
    auVar71._0_4_ = auVar42._0_4_ * 0.99999964;
    auVar71._4_4_ = auVar42._4_4_ * 0.99999964;
    auVar71._8_4_ = auVar42._8_4_ * 0.99999964;
    auVar71._12_4_ = auVar42._12_4_ * 0.99999964;
    auVar61._0_4_ = auVar42._0_4_ * 1.0000004;
    auVar61._4_4_ = auVar42._4_4_ * 1.0000004;
    auVar61._8_4_ = auVar42._8_4_ * 1.0000004;
    auVar61._12_4_ = auVar42._12_4_ * 1.0000004;
    uVar53 = *(undefined4 *)&(ray->org).field_0;
    local_a90._4_4_ = uVar53;
    local_a90._0_4_ = uVar53;
    local_a90._8_4_ = uVar53;
    local_a90._12_4_ = uVar53;
    auVar121 = ZEXT1664(local_a90);
    uVar53 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
    local_aa0._4_4_ = uVar53;
    local_aa0._0_4_ = uVar53;
    local_aa0._8_4_ = uVar53;
    local_aa0._12_4_ = uVar53;
    auVar132 = ZEXT1664(local_aa0);
    uVar53 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    local_ab0._4_4_ = uVar53;
    local_ab0._0_4_ = uVar53;
    local_ab0._8_4_ = uVar53;
    local_ab0._12_4_ = uVar53;
    auVar136 = ZEXT1664(local_ab0);
    auVar42 = vmovshdup_avx(auVar71);
    local_ad0 = vshufps_avx(auVar71,auVar71,0x55);
    auVar156 = ZEXT1664(local_ad0);
    auVar80 = vshufpd_avx(auVar71,auVar71,1);
    local_ae0 = vshufps_avx(auVar71,auVar71,0xaa);
    auVar162 = ZEXT1664(local_ae0);
    local_b00 = vshufps_avx(auVar61,auVar61,0x55);
    auVar171 = ZEXT1664(local_b00);
    local_b10 = vshufps_avx(auVar61,auVar61,0xaa);
    auVar115 = ZEXT1664(local_b10);
    uVar25 = (ulong)(auVar71._0_4_ < 0.0) << 4;
    uVar36 = (ulong)(auVar42._0_4_ < 0.0) << 4 | 0x20;
    uVar37 = (ulong)(auVar80._0_4_ < 0.0) << 4 | 0x40;
    uVar38 = uVar25 ^ 0x10;
    uVar39 = uVar36 ^ 0x10;
    uVar53 = auVar54._0_4_;
    local_b20._4_4_ = uVar53;
    local_b20._0_4_ = uVar53;
    local_b20._8_4_ = uVar53;
    local_b20._12_4_ = uVar53;
    auVar97 = ZEXT1664(local_b20);
    local_b30._4_4_ = fVar143;
    local_b30._0_4_ = fVar143;
    local_b30._8_4_ = fVar143;
    local_b30._12_4_ = fVar143;
    auVar108 = ZEXT1664(local_b30);
    local_a00._16_16_ = mm_lookupmask_ps._240_16_;
    local_a00._0_16_ = mm_lookupmask_ps._240_16_;
    local_9a0 = vperm2f128_avx(local_a00,mm_lookupmask_ps._0_32_,2);
    auVar65._8_4_ = 0x3f800000;
    auVar65._0_8_ = 0x3f8000003f800000;
    auVar65._12_4_ = 0x3f800000;
    auVar65._16_4_ = 0x3f800000;
    auVar65._20_4_ = 0x3f800000;
    auVar65._24_4_ = 0x3f800000;
    auVar65._28_4_ = 0x3f800000;
    auVar89._8_4_ = 0xbf800000;
    auVar89._0_8_ = 0xbf800000bf800000;
    auVar89._12_4_ = 0xbf800000;
    auVar89._16_4_ = 0xbf800000;
    auVar89._20_4_ = 0xbf800000;
    auVar89._24_4_ = 0xbf800000;
    auVar89._28_4_ = 0xbf800000;
    _local_9c0 = vblendvps_avx(auVar65,auVar89,local_9a0);
    local_ca8 = uVar25;
    local_ac0 = auVar71._0_4_;
    fStack_abc = auVar71._0_4_;
    fStack_ab8 = auVar71._0_4_;
    fStack_ab4 = auVar71._0_4_;
    local_af0 = auVar61._0_4_;
    fStack_aec = auVar61._0_4_;
    fStack_ae8 = auVar61._0_4_;
    fStack_ae4 = auVar61._0_4_;
    local_cb0 = uVar36;
    fVar143 = auVar71._0_4_;
    fVar145 = auVar71._0_4_;
    fVar147 = auVar71._0_4_;
    fVar165 = auVar61._0_4_;
    fVar166 = auVar61._0_4_;
    fVar167 = auVar61._0_4_;
    local_d30 = ray;
    local_d28 = context;
    do {
      uVar31 = local_c80[-1];
      local_c80 = local_c80 + -1;
      while ((uVar31 & 8) == 0) {
        uVar23 = uVar31 & 0xfffffffffffffff0;
        uVar53 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
        auVar41._4_4_ = uVar53;
        auVar41._0_4_ = uVar53;
        auVar41._8_4_ = uVar53;
        auVar41._12_4_ = uVar53;
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar25),auVar41,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + uVar25));
        auVar42 = vsubps_avx(auVar42,auVar121._0_16_);
        auVar54._0_4_ = auVar71._0_4_ * auVar42._0_4_;
        auVar54._4_4_ = fVar143 * auVar42._4_4_;
        auVar54._8_4_ = fVar145 * auVar42._8_4_;
        auVar54._12_4_ = fVar147 * auVar42._12_4_;
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar36),auVar41,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + uVar36));
        auVar42 = vsubps_avx(auVar42,auVar132._0_16_);
        auVar62._0_4_ = auVar156._0_4_ * auVar42._0_4_;
        auVar62._4_4_ = auVar156._4_4_ * auVar42._4_4_;
        auVar62._8_4_ = auVar156._8_4_ * auVar42._8_4_;
        auVar62._12_4_ = auVar156._12_4_ * auVar42._12_4_;
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar37),auVar41,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + uVar37));
        auVar42 = vsubps_avx(auVar42,auVar136._0_16_);
        auVar72._0_4_ = auVar162._0_4_ * auVar42._0_4_;
        auVar72._4_4_ = auVar162._4_4_ * auVar42._4_4_;
        auVar72._8_4_ = auVar162._8_4_ * auVar42._8_4_;
        auVar72._12_4_ = auVar162._12_4_ * auVar42._12_4_;
        auVar42 = vmaxps_avx(auVar62,auVar72);
        auVar80 = vmaxps_avx(auVar97._0_16_,auVar54);
        auVar42 = vmaxps_avx(auVar80,auVar42);
        auVar80 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar38),auVar41,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + uVar38));
        auVar80 = vsubps_avx(auVar80,auVar121._0_16_);
        auVar63._0_4_ = auVar61._0_4_ * auVar80._0_4_;
        auVar63._4_4_ = fVar165 * auVar80._4_4_;
        auVar63._8_4_ = fVar166 * auVar80._8_4_;
        auVar63._12_4_ = fVar167 * auVar80._12_4_;
        auVar80 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar39),auVar41,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + uVar39));
        auVar80 = vsubps_avx(auVar80,auVar132._0_16_);
        auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + (uVar37 ^ 0x10)),auVar41,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + (uVar37 ^ 0x10)));
        auVar73._0_4_ = auVar171._0_4_ * auVar80._0_4_;
        auVar73._4_4_ = auVar171._4_4_ * auVar80._4_4_;
        auVar73._8_4_ = auVar171._8_4_ * auVar80._8_4_;
        auVar73._12_4_ = auVar171._12_4_ * auVar80._12_4_;
        auVar80 = vsubps_avx(auVar54,auVar136._0_16_);
        auVar83._0_4_ = auVar115._0_4_ * auVar80._0_4_;
        auVar83._4_4_ = auVar115._4_4_ * auVar80._4_4_;
        auVar83._8_4_ = auVar115._8_4_ * auVar80._8_4_;
        auVar83._12_4_ = auVar115._12_4_ * auVar80._12_4_;
        auVar80 = vminps_avx(auVar73,auVar83);
        auVar54 = vminps_avx(auVar108._0_16_,auVar63);
        auVar80 = vminps_avx(auVar54,auVar80);
        if (((uint)uVar31 & 7) == 6) {
          auVar80 = vcmpps_avx(auVar42,auVar80,2);
          auVar42 = vcmpps_avx(*(undefined1 (*) [16])(uVar23 + 0xe0),auVar41,2);
          auVar54 = vcmpps_avx(auVar41,*(undefined1 (*) [16])(uVar23 + 0xf0),1);
          auVar42 = vandps_avx(auVar42,auVar54);
          auVar42 = vandps_avx(auVar42,auVar80);
        }
        else {
          auVar42 = vcmpps_avx(auVar42,auVar80,2);
        }
        auVar42 = vpslld_avx(auVar42,0x1f);
        uVar26 = vmovmskps_avx(auVar42);
        if (uVar26 == 0) goto LAB_004c4d42;
        uVar26 = uVar26 & 0xff;
        lVar34 = 0;
        for (uVar31 = (ulong)uVar26; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
          lVar34 = lVar34 + 1;
        }
        uVar31 = *(ulong *)(uVar23 + lVar34 * 8);
        uVar26 = uVar26 - 1 & uVar26;
        uVar27 = (ulong)uVar26;
        if (uVar26 != 0) {
          *local_c80 = uVar31;
          lVar34 = 0;
          for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
            lVar34 = lVar34 + 1;
          }
          uVar26 = uVar26 - 1 & uVar26;
          uVar27 = (ulong)uVar26;
          bVar40 = uVar26 == 0;
          while( true ) {
            local_c80 = local_c80 + 1;
            uVar31 = *(ulong *)(uVar23 + lVar34 * 8);
            if (bVar40) break;
            *local_c80 = uVar31;
            lVar34 = 0;
            for (uVar31 = uVar27; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              lVar34 = lVar34 + 1;
            }
            uVar27 = uVar27 - 1 & uVar27;
            bVar40 = uVar27 == 0;
          }
        }
      }
      local_c88 = (ulong)((uint)uVar31 & 0xf) - 8;
      if (local_c88 != 0) {
        uVar31 = uVar31 & 0xfffffffffffffff0;
        local_c90 = 0;
        do {
          lVar34 = local_c90 * 0x90;
          uVar23 = *(ulong *)(uVar31 + 0x20 + lVar34);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar23;
          auVar42 = vpmovzxbd_avx(auVar43);
          auVar42 = vcvtdq2ps_avx(auVar42);
          uVar53 = *(undefined4 *)(uVar31 + 0x44 + lVar34);
          auVar92._4_4_ = uVar53;
          auVar92._0_4_ = uVar53;
          auVar92._8_4_ = uVar53;
          auVar92._12_4_ = uVar53;
          uVar53 = *(undefined4 *)(uVar31 + 0x38 + lVar34);
          auVar98._4_4_ = uVar53;
          auVar98._0_4_ = uVar53;
          auVar98._8_4_ = uVar53;
          auVar98._12_4_ = uVar53;
          auVar54 = vfmadd213ps_fma(auVar42,auVar92,auVar98);
          auVar74._8_8_ = 0;
          auVar74._0_8_ = *(ulong *)(uVar31 + 0x50 + lVar34);
          auVar42 = vpmovzxbd_avx(auVar74);
          auVar42 = vcvtdq2ps_avx(auVar42);
          uVar53 = *(undefined4 *)(uVar31 + 0x74 + lVar34);
          auVar109._4_4_ = uVar53;
          auVar109._0_4_ = uVar53;
          auVar109._8_4_ = uVar53;
          auVar109._12_4_ = uVar53;
          uVar53 = *(undefined4 *)(uVar31 + 0x68 + lVar34);
          auVar117._4_4_ = uVar53;
          auVar117._0_4_ = uVar53;
          auVar117._8_4_ = uVar53;
          auVar117._12_4_ = uVar53;
          auVar61 = vfmadd213ps_fma(auVar42,auVar109,auVar117);
          auVar55._8_8_ = 0;
          auVar55._0_8_ = *(ulong *)(uVar31 + 0x24 + lVar34);
          auVar42 = vpmovzxbd_avx(auVar55);
          auVar42 = vcvtdq2ps_avx(auVar42);
          auVar71 = vfmadd213ps_fma(auVar42,auVar92,auVar98);
          auVar93._8_8_ = 0;
          auVar93._0_8_ = *(ulong *)(uVar31 + 0x54 + lVar34);
          auVar42 = vpmovzxbd_avx(auVar93);
          auVar42 = vcvtdq2ps_avx(auVar42);
          auVar81 = vfmadd213ps_fma(auVar42,auVar109,auVar117);
          auVar99._8_8_ = 0;
          auVar99._0_8_ = *(ulong *)(uVar31 + 0x28 + lVar34);
          auVar42 = vpmovzxbd_avx(auVar99);
          auVar42 = vcvtdq2ps_avx(auVar42);
          uVar53 = *(undefined4 *)(uVar31 + 0x48 + lVar34);
          auVar128._4_4_ = uVar53;
          auVar128._0_4_ = uVar53;
          auVar128._8_4_ = uVar53;
          auVar128._12_4_ = uVar53;
          uVar53 = *(undefined4 *)(uVar31 + 0x3c + lVar34);
          auVar133._4_4_ = uVar53;
          auVar133._0_4_ = uVar53;
          auVar133._8_4_ = uVar53;
          auVar133._12_4_ = uVar53;
          auVar82 = vfmadd213ps_fma(auVar42,auVar128,auVar133);
          auVar110._8_8_ = 0;
          auVar110._0_8_ = *(ulong *)(uVar31 + 0x58 + lVar34);
          auVar42 = vpmovzxbd_avx(auVar110);
          auVar42 = vcvtdq2ps_avx(auVar42);
          uVar53 = *(undefined4 *)(uVar31 + 0x78 + lVar34);
          auVar138._4_4_ = uVar53;
          auVar138._0_4_ = uVar53;
          auVar138._8_4_ = uVar53;
          auVar138._12_4_ = uVar53;
          uVar53 = *(undefined4 *)(uVar31 + 0x6c + lVar34);
          auVar153._4_4_ = uVar53;
          auVar153._0_4_ = uVar53;
          auVar153._8_4_ = uVar53;
          auVar153._12_4_ = uVar53;
          auVar41 = vfmadd213ps_fma(auVar42,auVar138,auVar153);
          auVar118._8_8_ = 0;
          auVar118._0_8_ = *(ulong *)(uVar31 + 0x2c + lVar34);
          auVar42 = vpmovzxbd_avx(auVar118);
          auVar42 = vcvtdq2ps_avx(auVar42);
          auVar62 = vfmadd213ps_fma(auVar42,auVar128,auVar133);
          auVar129._8_8_ = 0;
          auVar129._0_8_ = *(ulong *)(uVar31 + 0x5c + lVar34);
          auVar42 = vpmovzxbd_avx(auVar129);
          auVar42 = vcvtdq2ps_avx(auVar42);
          auVar63 = vfmadd213ps_fma(auVar42,auVar138,auVar153);
          auVar134._8_8_ = 0;
          auVar134._0_8_ = *(ulong *)(uVar31 + 0x30 + lVar34);
          auVar42 = vpmovzxbd_avx(auVar134);
          auVar42 = vcvtdq2ps_avx(auVar42);
          uVar53 = *(undefined4 *)(uVar31 + 0x4c + lVar34);
          auVar139._4_4_ = uVar53;
          auVar139._0_4_ = uVar53;
          auVar139._8_4_ = uVar53;
          auVar139._12_4_ = uVar53;
          uVar53 = *(undefined4 *)(uVar31 + 0x40 + lVar34);
          auVar154._4_4_ = uVar53;
          auVar154._0_4_ = uVar53;
          auVar154._8_4_ = uVar53;
          auVar154._12_4_ = uVar53;
          auVar72 = vfmadd213ps_fma(auVar42,auVar139,auVar154);
          auVar160._8_8_ = 0;
          auVar160._0_8_ = *(ulong *)(uVar31 + 0x60 + lVar34);
          auVar42 = vpmovzxbd_avx(auVar160);
          auVar42 = vcvtdq2ps_avx(auVar42);
          uVar53 = *(undefined4 *)(uVar31 + 0x7c + lVar34);
          auVar163._4_4_ = uVar53;
          auVar163._0_4_ = uVar53;
          auVar163._8_4_ = uVar53;
          auVar163._12_4_ = uVar53;
          auVar169._8_8_ = 0;
          auVar169._0_8_ = *(ulong *)(uVar31 + 0x34 + lVar34);
          auVar80 = vpmovzxbd_avx(auVar169);
          auVar80 = vcvtdq2ps_avx(auVar80);
          auVar80 = vfmadd213ps_fma(auVar80,auVar139,auVar154);
          uVar53 = *(undefined4 *)(uVar31 + 0x70 + lVar34);
          auVar140._4_4_ = uVar53;
          auVar140._0_4_ = uVar53;
          auVar140._8_4_ = uVar53;
          auVar140._12_4_ = uVar53;
          auVar73 = vfmadd213ps_fma(auVar42,auVar163,auVar140);
          auVar155._8_8_ = 0;
          auVar155._0_8_ = *(ulong *)(uVar31 + 100 + lVar34);
          auVar42 = vpmovzxbd_avx(auVar155);
          auVar42 = vcvtdq2ps_avx(auVar42);
          auVar83 = vfmadd213ps_fma(auVar42,auVar163,auVar140);
          fVar143 = ((ray->dir).field_0.m128[3] - *(float *)(uVar31 + 0x80 + lVar34)) *
                    *(float *)(uVar31 + 0x84 + lVar34);
          auVar141._4_4_ = fVar143;
          auVar141._0_4_ = fVar143;
          auVar141._8_4_ = fVar143;
          auVar141._12_4_ = fVar143;
          auVar42 = vsubps_avx(auVar61,auVar54);
          auVar54 = vfmadd213ps_fma(auVar42,auVar141,auVar54);
          auVar42 = vsubps_avx(auVar81,auVar71);
          auVar61 = vfmadd213ps_fma(auVar42,auVar141,auVar71);
          auVar42 = vsubps_avx(auVar41,auVar82);
          auVar71 = vfmadd213ps_fma(auVar42,auVar141,auVar82);
          auVar42 = vsubps_avx(auVar63,auVar62);
          auVar81 = vfmadd213ps_fma(auVar42,auVar141,auVar62);
          auVar42 = vsubps_avx(auVar73,auVar72);
          auVar82 = vfmadd213ps_fma(auVar42,auVar141,auVar72);
          auVar42 = vsubps_avx(auVar83,auVar80);
          auVar41 = vfmadd213ps_fma(auVar42,auVar141,auVar80);
          auVar42 = vpminub_avx(auVar43,auVar55);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar23;
          auVar42 = vpcmpeqb_avx(auVar44,auVar42);
          auVar80 = vsubps_avx(auVar54,local_a90);
          auVar56._0_4_ = local_ac0 * auVar80._0_4_;
          auVar56._4_4_ = fStack_abc * auVar80._4_4_;
          auVar56._8_4_ = fStack_ab8 * auVar80._8_4_;
          auVar56._12_4_ = fStack_ab4 * auVar80._12_4_;
          auVar80 = vsubps_avx(auVar71,local_aa0);
          auVar75._0_4_ = local_ad0._0_4_ * auVar80._0_4_;
          auVar75._4_4_ = local_ad0._4_4_ * auVar80._4_4_;
          auVar75._8_4_ = local_ad0._8_4_ * auVar80._8_4_;
          auVar75._12_4_ = local_ad0._12_4_ * auVar80._12_4_;
          auVar80 = vsubps_avx(auVar61,local_a90);
          auVar64._0_4_ = local_af0 * auVar80._0_4_;
          auVar64._4_4_ = fStack_aec * auVar80._4_4_;
          auVar64._8_4_ = fStack_ae8 * auVar80._8_4_;
          auVar64._12_4_ = fStack_ae4 * auVar80._12_4_;
          auVar80 = vsubps_avx(auVar81,local_aa0);
          auVar84._0_4_ = local_b00._0_4_ * auVar80._0_4_;
          auVar84._4_4_ = local_b00._4_4_ * auVar80._4_4_;
          auVar84._8_4_ = local_b00._8_4_ * auVar80._8_4_;
          auVar84._12_4_ = local_b00._12_4_ * auVar80._12_4_;
          auVar54 = vpminsd_avx(auVar56,auVar64);
          auVar80 = vpmaxsd_avx(auVar56,auVar64);
          auVar61 = vpminsd_avx(auVar75,auVar84);
          auVar54 = vpmaxsd_avx(auVar54,auVar61);
          auVar61 = vpmaxsd_avx(auVar75,auVar84);
          auVar71 = vsubps_avx(auVar82,local_ab0);
          auVar85._0_4_ = local_ae0._0_4_ * auVar71._0_4_;
          auVar85._4_4_ = local_ae0._4_4_ * auVar71._4_4_;
          auVar85._8_4_ = local_ae0._8_4_ * auVar71._8_4_;
          auVar85._12_4_ = local_ae0._12_4_ * auVar71._12_4_;
          auVar71 = vsubps_avx(auVar41,local_ab0);
          auVar94._0_4_ = local_b10._0_4_ * auVar71._0_4_;
          auVar94._4_4_ = local_b10._4_4_ * auVar71._4_4_;
          auVar94._8_4_ = local_b10._8_4_ * auVar71._8_4_;
          auVar94._12_4_ = local_b10._12_4_ * auVar71._12_4_;
          auVar71 = vpminsd_avx(auVar80,auVar61);
          auVar61 = vpminsd_avx(auVar85,auVar94);
          auVar80 = vpmaxsd_avx(auVar85,auVar94);
          auVar61 = vpmaxsd_avx(auVar61,local_b20);
          auVar54 = vpmaxsd_avx(auVar54,auVar61);
          auVar80 = vpminsd_avx(auVar80,local_b30);
          auVar80 = vpminsd_avx(auVar71,auVar80);
          auVar80 = vpcmpgtd_avx(auVar54,auVar80);
          auVar42 = vpmovsxbd_avx(auVar42);
          auVar42 = vpandn_avx(auVar80,auVar42);
          uVar26 = vmovmskps_avx(auVar42);
          if (uVar26 != 0) {
            uVar23 = (ulong)(uVar26 & 0xff);
            local_c98 = lVar34 + uVar31;
            local_d10 = local_d28->scene;
            do {
              local_c78 = uVar23;
              lVar34 = 0;
              for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                lVar34 = lVar34 + 1;
              }
              uVar3 = *(ushort *)(local_c98 + lVar34 * 8);
              uVar4 = *(ushort *)(local_c98 + 2 + lVar34 * 8);
              local_d08 = (ulong)*(uint *)(local_c98 + 0x88);
              local_ca0 = (ulong)*(uint *)(local_c98 + 4 + lVar34 * 8);
              pGVar35 = (local_d10->geometries).items[local_d08].ptr;
              local_c68 = *(long *)&pGVar35->field_0x58;
              local_c70 = pGVar35[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                          _M_i * local_ca0;
              fVar143 = (pGVar35->time_range).lower;
              fVar143 = pGVar35->fnumTimeSegments *
                        (((ray->dir).field_0.m128[3] - fVar143) /
                        ((pGVar35->time_range).upper - fVar143));
              auVar42 = vroundss_avx(ZEXT416((uint)fVar143),ZEXT416((uint)fVar143),9);
              auVar42 = vminss_avx(auVar42,ZEXT416((uint)(pGVar35->fnumTimeSegments + -1.0)));
              auVar61 = vmaxss_avx(ZEXT816(0) << 0x20,auVar42);
              local_d18 = uVar3 & 0x7fff;
              local_d1c = uVar4 & 0x7fff;
              uVar26 = *(uint *)(local_c68 + 4 + local_c70);
              uVar23 = CONCAT44(0,uVar26);
              uVar36 = (ulong)(uVar26 * local_d1c + *(int *)(local_c68 + local_c70) + local_d18);
              lVar34 = *(long *)&pGVar35[2].numPrimitives;
              lVar28 = (long)(int)auVar61._0_4_ * 0x38;
              lVar5 = *(long *)(lVar34 + 0x10 + lVar28);
              lVar6 = *(long *)(lVar34 + lVar28);
              auVar42 = *(undefined1 (*) [16])(lVar6 + lVar5 * uVar36);
              lVar7 = *(long *)(lVar34 + 0x48 + lVar28);
              auVar71 = *(undefined1 (*) [16])(lVar6 + (uVar36 + 1) * lVar5);
              local_a80._0_8_ = uVar23;
              lVar33 = uVar23 + uVar36;
              auVar80 = *(undefined1 (*) [16])(lVar6 + lVar33 * lVar5);
              lVar32 = uVar36 + uVar23 + 1;
              auVar81 = *(undefined1 (*) [16])(lVar6 + lVar32 * lVar5);
              lVar24 = uVar36 + (-1 < (short)uVar3) + 1;
              auVar82 = *(undefined1 (*) [16])(lVar6 + lVar24 * lVar5);
              lVar29 = (ulong)(-1 < (short)uVar3) + lVar32;
              auVar54 = *(undefined1 (*) [16])(lVar6 + lVar29 * lVar5);
              uVar25 = 0;
              if (-1 < (short)uVar4) {
                uVar25 = uVar23;
              }
              auVar41 = *(undefined1 (*) [16])(lVar6 + (lVar33 + uVar25) * lVar5);
              auVar62 = *(undefined1 (*) [16])(lVar6 + (lVar32 + uVar25) * lVar5);
              auVar63 = *(undefined1 (*) [16])(lVar6 + lVar5 * (uVar25 + lVar29));
              lVar34 = *(long *)(lVar34 + 0x38 + lVar28);
              fVar143 = fVar143 - auVar61._0_4_;
              auVar45._4_4_ = fVar143;
              auVar45._0_4_ = fVar143;
              auVar45._8_4_ = fVar143;
              auVar45._12_4_ = fVar143;
              auVar61 = vsubps_avx(*(undefined1 (*) [16])(lVar34 + lVar7 * uVar36),auVar42);
              auVar72 = vfmadd213ps_fma(auVar61,auVar45,auVar42);
              auVar42 = vsubps_avx(*(undefined1 (*) [16])(lVar34 + lVar7 * (uVar36 + 1)),auVar71);
              auVar73 = vfmadd213ps_fma(auVar42,auVar45,auVar71);
              auVar42 = vsubps_avx(*(undefined1 (*) [16])(lVar34 + lVar7 * lVar33),auVar80);
              auVar83 = vfmadd213ps_fma(auVar42,auVar45,auVar80);
              auVar42 = vsubps_avx(*(undefined1 (*) [16])(lVar34 + lVar7 * lVar32),auVar81);
              auVar43 = vfmadd213ps_fma(auVar42,auVar45,auVar81);
              auVar42 = vsubps_avx(*(undefined1 (*) [16])(lVar34 + lVar7 * lVar24),auVar82);
              auVar80 = vfmadd213ps_fma(auVar42,auVar45,auVar82);
              auVar42 = vsubps_avx(*(undefined1 (*) [16])(lVar34 + lVar7 * lVar29),auVar54);
              auVar44 = vfmadd213ps_fma(auVar42,auVar45,auVar54);
              auVar42 = vsubps_avx(*(undefined1 (*) [16])(lVar34 + lVar7 * (lVar33 + uVar25)),
                                   auVar41);
              auVar41 = vfmadd213ps_fma(auVar42,auVar45,auVar41);
              auVar42 = vsubps_avx(*(undefined1 (*) [16])(lVar34 + lVar7 * (lVar32 + uVar25)),
                                   auVar62);
              auVar62 = vfmadd213ps_fma(auVar42,auVar45,auVar62);
              auVar42 = vsubps_avx(*(undefined1 (*) [16])(lVar34 + (uVar25 + lVar29) * lVar7),
                                   auVar63);
              auVar63 = vfmadd213ps_fma(auVar42,auVar45,auVar63);
              auVar54 = vunpcklps_avx(auVar73,auVar44);
              auVar42 = vunpckhps_avx(auVar73,auVar44);
              auVar61 = vunpcklps_avx(auVar80,auVar43);
              auVar80 = vunpckhps_avx(auVar80,auVar43);
              auVar71 = vunpcklps_avx(auVar42,auVar80);
              auVar81 = vunpcklps_avx(auVar54,auVar61);
              auVar42 = vunpckhps_avx(auVar54,auVar61);
              auVar61 = vunpcklps_avx(auVar83,auVar62);
              auVar80 = vunpckhps_avx(auVar83,auVar62);
              auVar82 = vunpcklps_avx(auVar43,auVar41);
              auVar54 = vunpckhps_avx(auVar43,auVar41);
              auVar54 = vunpcklps_avx(auVar80,auVar54);
              auVar41 = vunpcklps_avx(auVar61,auVar82);
              auVar80 = vunpckhps_avx(auVar61,auVar82);
              auVar101._16_16_ = auVar62;
              auVar101._0_16_ = auVar83;
              auVar57._16_16_ = auVar44;
              auVar57._0_16_ = auVar73;
              auVar89 = vunpcklps_avx(auVar57,auVar101);
              auVar76._16_16_ = auVar63;
              auVar76._0_16_ = auVar43;
              auVar66._16_16_ = auVar43;
              auVar66._0_16_ = auVar72;
              auVar65 = vunpcklps_avx(auVar66,auVar76);
              auVar90 = vunpcklps_avx(auVar65,auVar89);
              auVar89 = vunpckhps_avx(auVar65,auVar89);
              auVar65 = vunpckhps_avx(auVar57,auVar101);
              auVar10 = vunpckhps_avx(auVar66,auVar76);
              auVar65 = vunpcklps_avx(auVar10,auVar65);
              auVar67._16_16_ = auVar81;
              auVar67._0_16_ = auVar81;
              auVar142._16_16_ = auVar42;
              auVar142._0_16_ = auVar42;
              auVar102._16_16_ = auVar71;
              auVar102._0_16_ = auVar71;
              auVar111._16_16_ = auVar41;
              auVar111._0_16_ = auVar41;
              auVar170._16_16_ = auVar80;
              auVar170._0_16_ = auVar80;
              uVar53 = *(undefined4 *)&(local_d30->org).field_0;
              auVar130._4_4_ = uVar53;
              auVar130._0_4_ = uVar53;
              auVar130._8_4_ = uVar53;
              auVar130._12_4_ = uVar53;
              auVar130._16_4_ = uVar53;
              auVar130._20_4_ = uVar53;
              auVar130._24_4_ = uVar53;
              auVar130._28_4_ = uVar53;
              uVar53 = *(undefined4 *)((long)&(local_d30->org).field_0 + 4);
              auVar135._4_4_ = uVar53;
              auVar135._0_4_ = uVar53;
              auVar135._8_4_ = uVar53;
              auVar135._12_4_ = uVar53;
              auVar135._16_4_ = uVar53;
              auVar135._20_4_ = uVar53;
              auVar135._24_4_ = uVar53;
              auVar135._28_4_ = uVar53;
              auVar164._16_16_ = auVar54;
              auVar164._0_16_ = auVar54;
              uVar53 = *(undefined4 *)((long)&(local_d30->org).field_0 + 8);
              auVar161._4_4_ = uVar53;
              auVar161._0_4_ = uVar53;
              auVar161._8_4_ = uVar53;
              auVar161._12_4_ = uVar53;
              auVar161._16_4_ = uVar53;
              auVar161._20_4_ = uVar53;
              auVar161._24_4_ = uVar53;
              auVar161._28_4_ = uVar53;
              local_c40 = vsubps_avx(auVar90,auVar130);
              local_c60 = vsubps_avx(auVar89,auVar135);
              local_b60._0_32_ = vsubps_avx(auVar65,auVar161);
              auVar89 = vsubps_avx(auVar67,auVar130);
              auVar65 = vsubps_avx(auVar142,auVar135);
              auVar10 = vsubps_avx(auVar102,auVar161);
              auVar90 = vsubps_avx(auVar111,auVar130);
              auVar57 = vsubps_avx(auVar170,auVar135);
              auVar69 = vsubps_avx(auVar164,auVar161);
              local_b80 = vsubps_avx(auVar90,local_c40);
              local_bc0 = vsubps_avx(auVar57,local_c60);
              local_ba0 = vsubps_avx(auVar69,local_b60._0_32_);
              auVar58._0_4_ = auVar90._0_4_ + local_c40._0_4_;
              auVar58._4_4_ = auVar90._4_4_ + local_c40._4_4_;
              auVar58._8_4_ = auVar90._8_4_ + local_c40._8_4_;
              auVar58._12_4_ = auVar90._12_4_ + local_c40._12_4_;
              auVar58._16_4_ = auVar90._16_4_ + local_c40._16_4_;
              auVar58._20_4_ = auVar90._20_4_ + local_c40._20_4_;
              auVar58._24_4_ = auVar90._24_4_ + local_c40._24_4_;
              auVar58._28_4_ = auVar90._28_4_ + local_c40._28_4_;
              auVar68._0_4_ = local_c60._0_4_ + auVar57._0_4_;
              auVar68._4_4_ = local_c60._4_4_ + auVar57._4_4_;
              auVar68._8_4_ = local_c60._8_4_ + auVar57._8_4_;
              auVar68._12_4_ = local_c60._12_4_ + auVar57._12_4_;
              auVar68._16_4_ = local_c60._16_4_ + auVar57._16_4_;
              auVar68._20_4_ = local_c60._20_4_ + auVar57._20_4_;
              auVar68._24_4_ = local_c60._24_4_ + auVar57._24_4_;
              auVar61._0_4_ = local_c60._28_4_;
              auVar68._28_4_ = auVar61._0_4_ + auVar57._28_4_;
              fVar143 = local_b60._0_4_;
              auVar103._0_4_ = auVar69._0_4_ + fVar143;
              fVar145 = local_b60._4_4_;
              auVar103._4_4_ = auVar69._4_4_ + fVar145;
              fVar147 = local_b60._8_4_;
              auVar103._8_4_ = auVar69._8_4_ + fVar147;
              auVar71._0_4_ = local_b60._12_4_;
              auVar103._12_4_ = auVar69._12_4_ + auVar71._0_4_;
              fVar165 = local_b60._16_4_;
              auVar103._16_4_ = auVar69._16_4_ + fVar165;
              fVar166 = local_b60._20_4_;
              auVar103._20_4_ = auVar69._20_4_ + fVar166;
              fVar167 = local_b60._24_4_;
              auVar103._24_4_ = auVar69._24_4_ + fVar167;
              auVar103._28_4_ = auVar69._28_4_ + local_b60._28_4_;
              auVar8._4_4_ = local_ba0._4_4_ * auVar68._4_4_;
              auVar8._0_4_ = local_ba0._0_4_ * auVar68._0_4_;
              auVar8._8_4_ = local_ba0._8_4_ * auVar68._8_4_;
              auVar8._12_4_ = local_ba0._12_4_ * auVar68._12_4_;
              auVar8._16_4_ = local_ba0._16_4_ * auVar68._16_4_;
              auVar8._20_4_ = local_ba0._20_4_ * auVar68._20_4_;
              auVar8._24_4_ = local_ba0._24_4_ * auVar68._24_4_;
              auVar8._28_4_ = uVar53;
              auVar80 = vfmsub231ps_fma(auVar8,local_bc0,auVar103);
              auVar9._4_4_ = local_b80._4_4_ * auVar103._4_4_;
              auVar9._0_4_ = local_b80._0_4_ * auVar103._0_4_;
              auVar9._8_4_ = local_b80._8_4_ * auVar103._8_4_;
              auVar9._12_4_ = local_b80._12_4_ * auVar103._12_4_;
              auVar9._16_4_ = local_b80._16_4_ * auVar103._16_4_;
              auVar9._20_4_ = local_b80._20_4_ * auVar103._20_4_;
              auVar9._24_4_ = local_b80._24_4_ * auVar103._24_4_;
              auVar9._28_4_ = auVar103._28_4_;
              auVar42 = vfmsub231ps_fma(auVar9,local_ba0,auVar58);
              auVar107._4_4_ = local_bc0._4_4_ * auVar58._4_4_;
              auVar107._0_4_ = local_bc0._0_4_ * auVar58._0_4_;
              auVar107._8_4_ = local_bc0._8_4_ * auVar58._8_4_;
              auVar107._12_4_ = local_bc0._12_4_ * auVar58._12_4_;
              auVar107._16_4_ = local_bc0._16_4_ * auVar58._16_4_;
              auVar107._20_4_ = local_bc0._20_4_ * auVar58._20_4_;
              auVar107._24_4_ = local_bc0._24_4_ * auVar58._24_4_;
              auVar107._28_4_ = auVar58._28_4_;
              auVar54 = vfmsub231ps_fma(auVar107,local_b80,auVar68);
              uVar53 = *(undefined4 *)((long)&(local_d30->dir).field_0 + 4);
              local_d00._4_4_ = uVar53;
              local_d00._0_4_ = uVar53;
              local_d00._8_4_ = uVar53;
              local_d00._12_4_ = uVar53;
              local_d00._16_4_ = uVar53;
              local_d00._20_4_ = uVar53;
              local_d00._24_4_ = uVar53;
              local_d00._28_4_ = uVar53;
              fStack_a18 = (local_d30->dir).field_0.m128[2];
              auVar79._4_4_ = fStack_a18 * auVar54._4_4_;
              auVar79._0_4_ = fStack_a18 * auVar54._0_4_;
              auVar79._8_4_ = fStack_a18 * auVar54._8_4_;
              auVar79._12_4_ = fStack_a18 * auVar54._12_4_;
              auVar79._16_4_ = fStack_a18 * 0.0;
              auVar79._20_4_ = fStack_a18 * 0.0;
              auVar79._24_4_ = fStack_a18 * 0.0;
              auVar79._28_4_ = auVar68._28_4_;
              auVar42 = vfmadd231ps_fma(auVar79,local_d00,ZEXT1632(auVar42));
              uVar53 = *(undefined4 *)&(local_d30->dir).field_0;
              local_ce0._4_4_ = uVar53;
              local_ce0._0_4_ = uVar53;
              local_ce0._8_4_ = uVar53;
              local_ce0._12_4_ = uVar53;
              local_ce0._16_4_ = uVar53;
              local_ce0._20_4_ = uVar53;
              local_ce0._24_4_ = uVar53;
              local_ce0._28_4_ = uVar53;
              auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),local_ce0._0_32_,ZEXT1632(auVar80));
              local_a40 = vsubps_avx(local_c60,auVar65);
              auVar8 = vsubps_avx(local_b60._0_32_,auVar10);
              auVar59._0_4_ = local_c60._0_4_ + auVar65._0_4_;
              auVar59._4_4_ = local_c60._4_4_ + auVar65._4_4_;
              auVar59._8_4_ = local_c60._8_4_ + auVar65._8_4_;
              auVar59._12_4_ = local_c60._12_4_ + auVar65._12_4_;
              auVar59._16_4_ = local_c60._16_4_ + auVar65._16_4_;
              auVar59._20_4_ = local_c60._20_4_ + auVar65._20_4_;
              auVar59._24_4_ = local_c60._24_4_ + auVar65._24_4_;
              auVar59._28_4_ = auVar61._0_4_ + auVar65._28_4_;
              auVar104._0_4_ = auVar10._0_4_ + fVar143;
              auVar104._4_4_ = auVar10._4_4_ + fVar145;
              auVar104._8_4_ = auVar10._8_4_ + fVar147;
              auVar104._12_4_ = auVar10._12_4_ + auVar71._0_4_;
              auVar104._16_4_ = auVar10._16_4_ + fVar165;
              auVar104._20_4_ = auVar10._20_4_ + fVar166;
              auVar104._24_4_ = auVar10._24_4_ + fVar167;
              auVar104._28_4_ = auVar10._28_4_ + local_b60._28_4_;
              fVar168 = auVar8._0_4_;
              fVar172 = auVar8._4_4_;
              auVar11._4_4_ = fVar172 * auVar59._4_4_;
              auVar11._0_4_ = fVar168 * auVar59._0_4_;
              fVar173 = auVar8._8_4_;
              auVar11._8_4_ = fVar173 * auVar59._8_4_;
              fVar174 = auVar8._12_4_;
              auVar11._12_4_ = fVar174 * auVar59._12_4_;
              fVar175 = auVar8._16_4_;
              auVar11._16_4_ = fVar175 * auVar59._16_4_;
              fVar176 = auVar8._20_4_;
              auVar11._20_4_ = fVar176 * auVar59._20_4_;
              fVar177 = auVar8._24_4_;
              auVar11._24_4_ = fVar177 * auVar59._24_4_;
              auVar11._28_4_ = auVar61._0_4_;
              auVar54 = vfmsub231ps_fma(auVar11,local_a40,auVar104);
              local_a60 = vsubps_avx(local_c40,auVar89);
              auVar61._0_4_ = local_a60._0_4_;
              fVar47 = local_a60._4_4_;
              auVar12._4_4_ = auVar104._4_4_ * fVar47;
              auVar12._0_4_ = auVar104._0_4_ * auVar61._0_4_;
              fVar48 = local_a60._8_4_;
              auVar12._8_4_ = auVar104._8_4_ * fVar48;
              fVar49 = local_a60._12_4_;
              auVar12._12_4_ = auVar104._12_4_ * fVar49;
              fVar50 = local_a60._16_4_;
              auVar12._16_4_ = auVar104._16_4_ * fVar50;
              fVar51 = local_a60._20_4_;
              auVar12._20_4_ = auVar104._20_4_ * fVar51;
              fVar52 = local_a60._24_4_;
              auVar12._24_4_ = auVar104._24_4_ * fVar52;
              auVar12._28_4_ = local_b80._28_4_;
              auVar105._0_4_ = local_c40._0_4_ + auVar89._0_4_;
              auVar105._4_4_ = local_c40._4_4_ + auVar89._4_4_;
              auVar105._8_4_ = local_c40._8_4_ + auVar89._8_4_;
              auVar105._12_4_ = local_c40._12_4_ + auVar89._12_4_;
              auVar105._16_4_ = local_c40._16_4_ + auVar89._16_4_;
              auVar105._20_4_ = local_c40._20_4_ + auVar89._20_4_;
              auVar105._24_4_ = local_c40._24_4_ + auVar89._24_4_;
              auVar105._28_4_ = local_c40._28_4_ + auVar89._28_4_;
              auVar80 = vfmsub231ps_fma(auVar12,auVar8,auVar105);
              fVar137 = local_a40._0_4_;
              fVar144 = local_a40._4_4_;
              auVar13._4_4_ = fVar144 * auVar105._4_4_;
              auVar13._0_4_ = fVar137 * auVar105._0_4_;
              fVar146 = local_a40._8_4_;
              auVar13._8_4_ = fVar146 * auVar105._8_4_;
              fVar148 = local_a40._12_4_;
              auVar13._12_4_ = fVar148 * auVar105._12_4_;
              fVar149 = local_a40._16_4_;
              auVar13._16_4_ = fVar149 * auVar105._16_4_;
              fVar150 = local_a40._20_4_;
              auVar13._20_4_ = fVar150 * auVar105._20_4_;
              fVar151 = local_a40._24_4_;
              auVar13._24_4_ = fVar151 * auVar105._24_4_;
              auVar13._28_4_ = auVar105._28_4_;
              auVar81 = vfmsub231ps_fma(auVar13,local_a60,auVar59);
              auVar106._0_4_ = fStack_a18 * auVar81._0_4_;
              auVar106._4_4_ = fStack_a18 * auVar81._4_4_;
              auVar106._8_4_ = fStack_a18 * auVar81._8_4_;
              auVar106._12_4_ = fStack_a18 * auVar81._12_4_;
              auVar106._16_4_ = fStack_a18 * 0.0;
              auVar106._20_4_ = fStack_a18 * 0.0;
              auVar106._24_4_ = fStack_a18 * 0.0;
              auVar106._28_4_ = 0;
              auVar80 = vfmadd231ps_fma(auVar106,local_d00,ZEXT1632(auVar80));
              auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),local_ce0._0_32_,ZEXT1632(auVar54));
              auVar9 = vsubps_avx(auVar89,auVar90);
              auVar112._0_4_ = auVar89._0_4_ + auVar90._0_4_;
              auVar112._4_4_ = auVar89._4_4_ + auVar90._4_4_;
              auVar112._8_4_ = auVar89._8_4_ + auVar90._8_4_;
              auVar112._12_4_ = auVar89._12_4_ + auVar90._12_4_;
              auVar112._16_4_ = auVar89._16_4_ + auVar90._16_4_;
              auVar112._20_4_ = auVar89._20_4_ + auVar90._20_4_;
              auVar112._24_4_ = auVar89._24_4_ + auVar90._24_4_;
              auVar112._28_4_ = auVar89._28_4_ + auVar90._28_4_;
              auVar90 = vsubps_avx(auVar65,auVar57);
              auVar86._0_4_ = auVar65._0_4_ + auVar57._0_4_;
              auVar86._4_4_ = auVar65._4_4_ + auVar57._4_4_;
              auVar86._8_4_ = auVar65._8_4_ + auVar57._8_4_;
              auVar86._12_4_ = auVar65._12_4_ + auVar57._12_4_;
              auVar86._16_4_ = auVar65._16_4_ + auVar57._16_4_;
              auVar86._20_4_ = auVar65._20_4_ + auVar57._20_4_;
              auVar86._24_4_ = auVar65._24_4_ + auVar57._24_4_;
              auVar86._28_4_ = auVar65._28_4_ + auVar57._28_4_;
              auVar57 = vsubps_avx(auVar10,auVar69);
              auVar77._0_4_ = auVar10._0_4_ + auVar69._0_4_;
              auVar77._4_4_ = auVar10._4_4_ + auVar69._4_4_;
              auVar77._8_4_ = auVar10._8_4_ + auVar69._8_4_;
              auVar77._12_4_ = auVar10._12_4_ + auVar69._12_4_;
              auVar77._16_4_ = auVar10._16_4_ + auVar69._16_4_;
              auVar77._20_4_ = auVar10._20_4_ + auVar69._20_4_;
              auVar77._24_4_ = auVar10._24_4_ + auVar69._24_4_;
              auVar77._28_4_ = auVar10._28_4_ + auVar69._28_4_;
              auVar119._0_4_ = auVar86._0_4_ * auVar57._0_4_;
              auVar119._4_4_ = auVar86._4_4_ * auVar57._4_4_;
              auVar119._8_4_ = auVar86._8_4_ * auVar57._8_4_;
              auVar119._12_4_ = auVar86._12_4_ * auVar57._12_4_;
              auVar119._16_4_ = auVar86._16_4_ * auVar57._16_4_;
              auVar119._20_4_ = auVar86._20_4_ * auVar57._20_4_;
              auVar119._24_4_ = auVar86._24_4_ * auVar57._24_4_;
              auVar119._28_4_ = 0;
              auVar81 = vfmsub231ps_fma(auVar119,auVar90,auVar77);
              auVar10._4_4_ = auVar77._4_4_ * auVar9._4_4_;
              auVar10._0_4_ = auVar77._0_4_ * auVar9._0_4_;
              auVar10._8_4_ = auVar77._8_4_ * auVar9._8_4_;
              auVar10._12_4_ = auVar77._12_4_ * auVar9._12_4_;
              auVar10._16_4_ = auVar77._16_4_ * auVar9._16_4_;
              auVar10._20_4_ = auVar77._20_4_ * auVar9._20_4_;
              auVar10._24_4_ = auVar77._24_4_ * auVar9._24_4_;
              auVar10._28_4_ = auVar77._28_4_;
              auVar54 = vfmsub231ps_fma(auVar10,auVar57,auVar112);
              auVar69._4_4_ = auVar112._4_4_ * auVar90._4_4_;
              auVar69._0_4_ = auVar112._0_4_ * auVar90._0_4_;
              auVar69._8_4_ = auVar112._8_4_ * auVar90._8_4_;
              auVar69._12_4_ = auVar112._12_4_ * auVar90._12_4_;
              auVar69._16_4_ = auVar112._16_4_ * auVar90._16_4_;
              auVar69._20_4_ = auVar112._20_4_ * auVar90._20_4_;
              auVar69._24_4_ = auVar112._24_4_ * auVar90._24_4_;
              auVar69._28_4_ = auVar112._28_4_;
              auVar82 = vfmsub231ps_fma(auVar69,auVar9,auVar86);
              _local_a20 = CONCAT44(fStack_a18,fStack_a18);
              fStack_a14 = fStack_a18;
              fStack_a10 = fStack_a18;
              fStack_a0c = fStack_a18;
              fStack_a08 = fStack_a18;
              fStack_a04 = fStack_a18;
              auVar14._4_4_ = fStack_a18 * auVar82._4_4_;
              auVar14._0_4_ = fStack_a18 * auVar82._0_4_;
              auVar14._8_4_ = fStack_a18 * auVar82._8_4_;
              auVar14._12_4_ = fStack_a18 * auVar82._12_4_;
              auVar14._16_4_ = fStack_a18 * 0.0;
              auVar14._20_4_ = fStack_a18 * 0.0;
              auVar14._24_4_ = fStack_a18 * 0.0;
              auVar14._28_4_ = auVar86._28_4_;
              auVar54 = vfmadd231ps_fma(auVar14,local_d00,ZEXT1632(auVar54));
              auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),local_ce0._0_32_,ZEXT1632(auVar81));
              fVar152 = auVar54._0_4_ + auVar42._0_4_ + auVar80._0_4_;
              fVar157 = auVar54._4_4_ + auVar42._4_4_ + auVar80._4_4_;
              fVar158 = auVar54._8_4_ + auVar42._8_4_ + auVar80._8_4_;
              fVar159 = auVar54._12_4_ + auVar42._12_4_ + auVar80._12_4_;
              local_920 = ZEXT1632(CONCAT412(fVar159,CONCAT48(fVar158,CONCAT44(fVar157,fVar152))));
              auVar78._8_4_ = 0x7fffffff;
              auVar78._0_8_ = 0x7fffffff7fffffff;
              auVar78._12_4_ = 0x7fffffff;
              auVar78._16_4_ = 0x7fffffff;
              auVar78._20_4_ = 0x7fffffff;
              auVar78._24_4_ = 0x7fffffff;
              auVar78._28_4_ = 0x7fffffff;
              auVar69 = ZEXT1632(auVar42);
              auVar89 = vminps_avx(auVar69,ZEXT1632(auVar80));
              auVar89 = vminps_avx(auVar89,ZEXT1632(auVar54));
              local_9e0 = vandps_avx(local_920,auVar78);
              fVar116 = local_9e0._0_4_ * 1.1920929e-07;
              fVar122 = local_9e0._4_4_ * 1.1920929e-07;
              auVar15._4_4_ = fVar122;
              auVar15._0_4_ = fVar116;
              fVar123 = local_9e0._8_4_ * 1.1920929e-07;
              auVar15._8_4_ = fVar123;
              fVar124 = local_9e0._12_4_ * 1.1920929e-07;
              auVar15._12_4_ = fVar124;
              fVar125 = local_9e0._16_4_ * 1.1920929e-07;
              auVar15._16_4_ = fVar125;
              fVar126 = local_9e0._20_4_ * 1.1920929e-07;
              auVar15._20_4_ = fVar126;
              fVar127 = local_9e0._24_4_ * 1.1920929e-07;
              auVar15._24_4_ = fVar127;
              auVar15._28_4_ = 0x34000000;
              auVar131._0_8_ = CONCAT44(fVar122,fVar116) ^ 0x8000000080000000;
              auVar131._8_4_ = -fVar123;
              auVar131._12_4_ = -fVar124;
              auVar131._16_4_ = -fVar125;
              auVar131._20_4_ = -fVar126;
              auVar131._24_4_ = -fVar127;
              auVar131._28_4_ = 0xb4000000;
              auVar89 = vcmpps_avx(auVar89,auVar131,5);
              auVar107 = ZEXT1632(auVar80);
              auVar65 = vmaxps_avx(auVar69,auVar107);
              auVar65 = vmaxps_avx(auVar65,ZEXT1632(auVar54));
              auVar65 = vcmpps_avx(auVar65,auVar15,2);
              auVar65 = vorps_avx(auVar89,auVar65);
              auVar10 = local_a00 & auVar65;
              if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar10 >> 0x7f,0) != '\0') ||
                    (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0xbf,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar10[0x1f] < '\0') {
                local_a80 = auVar65;
                auVar16._4_4_ = local_ba0._4_4_ * fVar144;
                auVar16._0_4_ = local_ba0._0_4_ * fVar137;
                auVar16._8_4_ = local_ba0._8_4_ * fVar146;
                auVar16._12_4_ = local_ba0._12_4_ * fVar148;
                auVar16._16_4_ = local_ba0._16_4_ * fVar149;
                auVar16._20_4_ = local_ba0._20_4_ * fVar150;
                auVar16._24_4_ = local_ba0._24_4_ * fVar151;
                auVar16._28_4_ = auVar65._28_4_;
                local_980 = 0x80000000;
                uStack_97c = 0x80000000;
                uStack_978 = 0x80000000;
                uStack_974 = 0x80000000;
                uStack_970 = 0x80000000;
                uStack_96c = 0x80000000;
                uStack_968 = 0x80000000;
                uStack_964 = 0x80000000;
                auVar17._4_4_ = local_bc0._4_4_ * fVar47;
                auVar17._0_4_ = local_bc0._0_4_ * auVar61._0_4_;
                auVar17._8_4_ = local_bc0._8_4_ * fVar48;
                auVar17._12_4_ = local_bc0._12_4_ * fVar49;
                auVar17._16_4_ = local_bc0._16_4_ * fVar50;
                auVar17._20_4_ = local_bc0._20_4_ * fVar51;
                auVar17._24_4_ = local_bc0._24_4_ * fVar52;
                auVar17._28_4_ = auVar89._28_4_;
                auVar42 = vfmsub213ps_fma(local_bc0,auVar8,auVar16);
                auVar18._4_4_ = fVar172 * auVar90._4_4_;
                auVar18._0_4_ = fVar168 * auVar90._0_4_;
                auVar18._8_4_ = fVar173 * auVar90._8_4_;
                auVar18._12_4_ = fVar174 * auVar90._12_4_;
                auVar18._16_4_ = fVar175 * auVar90._16_4_;
                auVar18._20_4_ = fVar176 * auVar90._20_4_;
                auVar18._24_4_ = fVar177 * auVar90._24_4_;
                auVar18._28_4_ = 0x34000000;
                local_bc0 = local_920;
                auVar19._4_4_ = fVar47 * auVar57._4_4_;
                auVar19._0_4_ = auVar61._0_4_ * auVar57._0_4_;
                auVar19._8_4_ = fVar48 * auVar57._8_4_;
                auVar19._12_4_ = fVar49 * auVar57._12_4_;
                auVar19._16_4_ = fVar50 * auVar57._16_4_;
                auVar19._20_4_ = fVar51 * auVar57._20_4_;
                auVar19._24_4_ = fVar52 * auVar57._24_4_;
                auVar19._28_4_ = 0;
                auVar80 = vfmsub213ps_fma(auVar57,local_a40,auVar18);
                auVar89 = vandps_avx(auVar16,auVar78);
                auVar10 = vandps_avx(auVar18,auVar78);
                auVar89 = vcmpps_avx(auVar89,auVar10,1);
                auVar57 = vblendvps_avx(ZEXT1632(auVar80),ZEXT1632(auVar42),auVar89);
                auVar20._4_4_ = fVar144 * auVar9._4_4_;
                auVar20._0_4_ = fVar137 * auVar9._0_4_;
                auVar20._8_4_ = fVar146 * auVar9._8_4_;
                auVar20._12_4_ = fVar148 * auVar9._12_4_;
                auVar20._16_4_ = fVar149 * auVar9._16_4_;
                auVar20._20_4_ = fVar150 * auVar9._20_4_;
                auVar20._24_4_ = fVar151 * auVar9._24_4_;
                auVar20._28_4_ = auVar89._28_4_;
                auVar42 = vfmsub213ps_fma(auVar9,auVar8,auVar19);
                auVar96._0_4_ = local_b80._0_4_ * fVar168;
                auVar96._4_4_ = local_b80._4_4_ * fVar172;
                auVar96._8_4_ = local_b80._8_4_ * fVar173;
                auVar96._12_4_ = local_b80._12_4_ * fVar174;
                auVar96._16_4_ = local_b80._16_4_ * fVar175;
                auVar96._20_4_ = local_b80._20_4_ * fVar176;
                auVar96._24_4_ = local_b80._24_4_ * fVar177;
                auVar96._28_4_ = 0;
                auVar80 = vfmsub213ps_fma(local_ba0,local_a60,auVar96);
                auVar89 = vandps_avx(auVar96,auVar78);
                auVar10 = vandps_avx(auVar19,auVar78);
                auVar89 = vcmpps_avx(auVar89,auVar10,1);
                auVar9 = vblendvps_avx(ZEXT1632(auVar42),ZEXT1632(auVar80),auVar89);
                auVar42 = vfmsub213ps_fma(local_b80,local_a40,auVar17);
                auVar80 = vfmsub213ps_fma(auVar90,local_a60,auVar20);
                auVar89 = vandps_avx(auVar17,auVar78);
                auVar10 = vandps_avx(auVar20,auVar78);
                auVar89 = vcmpps_avx(auVar89,auVar10,1);
                auVar10 = vblendvps_avx(ZEXT1632(auVar80),ZEXT1632(auVar42),auVar89);
                auVar61._0_4_ = auVar10._0_4_;
                fVar47 = auVar10._4_4_;
                auVar90._4_4_ = fVar47 * fStack_a18;
                auVar90._0_4_ = auVar61._0_4_ * fStack_a18;
                fVar48 = auVar10._8_4_;
                auVar90._8_4_ = fVar48 * fStack_a18;
                fVar49 = auVar10._12_4_;
                auVar90._12_4_ = fVar49 * fStack_a18;
                fVar50 = auVar10._16_4_;
                auVar90._16_4_ = fVar50 * fStack_a18;
                fVar51 = auVar10._20_4_;
                auVar90._20_4_ = fVar51 * fStack_a18;
                fVar52 = auVar10._24_4_;
                auVar90._24_4_ = fVar52 * fStack_a18;
                auVar90._28_4_ = auVar89._28_4_;
                auVar42 = vfmadd213ps_fma(local_d00,auVar9,auVar90);
                auVar42 = vfmadd213ps_fma(local_ce0._0_32_,auVar57,ZEXT1632(auVar42));
                fVar116 = auVar42._0_4_ + auVar42._0_4_;
                fVar122 = auVar42._4_4_ + auVar42._4_4_;
                fVar123 = auVar42._8_4_ + auVar42._8_4_;
                fVar124 = auVar42._12_4_ + auVar42._12_4_;
                auVar79 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar123,CONCAT44(fVar122,fVar116))));
                auVar87._0_4_ = auVar61._0_4_ * fVar143;
                auVar87._4_4_ = fVar47 * fVar145;
                auVar87._8_4_ = fVar48 * fVar147;
                auVar87._12_4_ = fVar49 * auVar71._0_4_;
                auVar87._16_4_ = fVar50 * fVar165;
                auVar87._20_4_ = fVar51 * fVar166;
                auVar87._24_4_ = fVar52 * fVar167;
                auVar87._28_4_ = 0;
                auVar42 = vfmadd213ps_fma(local_c60,auVar9,auVar87);
                auVar89 = vrcpps_avx(auVar79);
                auVar80 = vfmadd213ps_fma(local_c40,auVar57,ZEXT1632(auVar42));
                auVar120._8_4_ = 0x3f800000;
                auVar120._0_8_ = 0x3f8000003f800000;
                auVar120._12_4_ = 0x3f800000;
                auVar120._16_4_ = 0x3f800000;
                auVar120._20_4_ = 0x3f800000;
                auVar120._24_4_ = 0x3f800000;
                auVar120._28_4_ = 0x3f800000;
                auVar42 = vfnmadd213ps_fma(auVar89,auVar79,auVar120);
                auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar89,auVar89);
                local_880 = ZEXT1632(CONCAT412((auVar80._12_4_ + auVar80._12_4_) * auVar42._12_4_,
                                               CONCAT48((auVar80._8_4_ + auVar80._8_4_) *
                                                        auVar42._8_4_,
                                                        CONCAT44((auVar80._4_4_ + auVar80._4_4_) *
                                                                 auVar42._4_4_,
                                                                 (auVar80._0_4_ + auVar80._0_4_) *
                                                                 auVar42._0_4_))));
                uVar53 = *(undefined4 *)((long)&(local_d30->org).field_0 + 0xc);
                auVar88._4_4_ = uVar53;
                auVar88._0_4_ = uVar53;
                auVar88._8_4_ = uVar53;
                auVar88._12_4_ = uVar53;
                auVar88._16_4_ = uVar53;
                auVar88._20_4_ = uVar53;
                auVar88._24_4_ = uVar53;
                auVar88._28_4_ = uVar53;
                auVar89 = vcmpps_avx(auVar88,local_880,2);
                fVar143 = local_d30->tfar;
                auVar113._4_4_ = fVar143;
                auVar113._0_4_ = fVar143;
                auVar113._8_4_ = fVar143;
                auVar113._12_4_ = fVar143;
                auVar113._16_4_ = fVar143;
                auVar113._20_4_ = fVar143;
                auVar113._24_4_ = fVar143;
                auVar113._28_4_ = fVar143;
                auVar90 = vcmpps_avx(local_880,auVar113,2);
                auVar89 = vandps_avx(auVar90,auVar89);
                auVar114._0_8_ = CONCAT44(fVar122,fVar116) ^ 0x8000000080000000;
                auVar114._8_4_ = -fVar123;
                auVar114._12_4_ = -fVar124;
                auVar114._16_4_ = 0x80000000;
                auVar114._20_4_ = 0x80000000;
                auVar114._24_4_ = 0x80000000;
                auVar114._28_4_ = 0x80000000;
                auVar90 = vcmpps_avx(auVar79,auVar114,4);
                auVar89 = vandps_avx(auVar90,auVar89);
                auVar65 = vandps_avx(auVar65,local_a00);
                auVar89 = vpslld_avx2(auVar89,0x1f);
                auVar90 = vpsrad_avx2(auVar89,0x1f);
                auVar89 = auVar65 & auVar90;
                if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar89 >> 0x7f,0) != '\0') ||
                      (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar89 >> 0xbf,0) != '\0') ||
                    (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar89[0x1f] < '\0') {
                  auVar2._0_4_ = local_d30->tfar;
                  auVar2._4_4_ = local_d30->mask;
                  auVar2._8_4_ = local_d30->id;
                  auVar2._12_4_ = local_d30->flags;
                  local_8e0 = vandps_avx(auVar90,auVar65);
                  uVar26 = vextractps_avx(auVar2,1);
                  local_900 = &local_d31;
                  auVar89 = vsubps_avx(local_920,auVar107);
                  local_960 = vblendvps_avx(auVar69,auVar89,local_9a0);
                  auVar89 = vsubps_avx(local_920,auVar69);
                  local_940 = vblendvps_avx(auVar107,auVar89,local_9a0);
                  local_860._4_4_ = auVar57._4_4_ * (float)local_9c0._4_4_;
                  local_860._0_4_ = auVar57._0_4_ * (float)local_9c0._0_4_;
                  local_860._8_4_ = auVar57._8_4_ * fStack_9b8;
                  local_860._12_4_ = auVar57._12_4_ * fStack_9b4;
                  local_860._16_4_ = auVar57._16_4_ * fStack_9b0;
                  local_860._20_4_ = auVar57._20_4_ * fStack_9ac;
                  local_860._24_4_ = auVar57._24_4_ * fStack_9a8;
                  local_860._28_4_ = 0;
                  local_840._4_4_ = (float)local_9c0._4_4_ * auVar9._4_4_;
                  local_840._0_4_ = (float)local_9c0._0_4_ * auVar9._0_4_;
                  local_840._8_4_ = fStack_9b8 * auVar9._8_4_;
                  local_840._12_4_ = fStack_9b4 * auVar9._12_4_;
                  local_840._16_4_ = fStack_9b0 * auVar9._16_4_;
                  local_840._20_4_ = fStack_9ac * auVar9._20_4_;
                  local_840._24_4_ = fStack_9a8 * auVar9._24_4_;
                  local_840._28_4_ = auVar9._28_4_;
                  local_820._4_4_ = (float)local_9c0._4_4_ * fVar47;
                  local_820._0_4_ = (float)local_9c0._0_4_ * auVar61._0_4_;
                  local_820._8_4_ = fStack_9b8 * fVar48;
                  local_820._12_4_ = fStack_9b4 * fVar49;
                  local_820._16_4_ = fStack_9b0 * fVar50;
                  local_820._20_4_ = fStack_9ac * fVar51;
                  local_820._24_4_ = fStack_9a8 * fVar52;
                  local_820._28_4_ = auVar10._28_4_;
                  pGVar35 = (local_d10->geometries).items[local_d08].ptr;
                  if ((pGVar35->mask & uVar26) != 0) {
                    pRVar30 = local_d28->args;
                    if ((pRVar30->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar35->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_004c4d5a:
                      local_d30->tfar = -INFINITY;
                      return;
                    }
                    auVar46._0_8_ = (ulong)CONCAT24(uVar3,(uint)uVar3) & 0x7fff00007fff;
                    auVar46._8_4_ = local_d18;
                    auVar46._12_4_ = local_d18;
                    auVar46._16_4_ = local_d18;
                    auVar46._20_4_ = local_d18;
                    auVar46._24_4_ = local_d18;
                    auVar46._28_4_ = local_d18;
                    auVar89 = vpaddd_avx2(auVar46,_DAT_01fec4a0);
                    auVar60._0_8_ = (ulong)CONCAT24(uVar4,(uint)uVar4) & 0x7fff00007fff;
                    auVar60._8_4_ = local_d1c;
                    auVar60._12_4_ = local_d1c;
                    auVar60._16_4_ = local_d1c;
                    auVar60._20_4_ = local_d1c;
                    auVar60._24_4_ = local_d1c;
                    auVar60._28_4_ = local_d1c;
                    auVar95._0_4_ = (float)(int)(*(ushort *)(local_c68 + 8 + local_c70) - 1);
                    auVar95._4_12_ = auVar8._4_12_;
                    auVar10 = vpaddd_avx2(auVar60,_DAT_01fec4c0);
                    auVar42 = vrcpss_avx(auVar95,auVar95);
                    auVar80 = vfnmadd213ss_fma(auVar95,auVar42,SUB6416(ZEXT464(0x40000000),0));
                    fVar143 = auVar42._0_4_ * auVar80._0_4_;
                    auVar100._0_4_ = (float)(int)(*(ushort *)(local_c68 + 10 + local_c70) - 1);
                    auVar100._4_12_ = auVar8._4_12_;
                    auVar42 = vrcpss_avx(auVar100,auVar100);
                    auVar80 = vfnmadd213ss_fma(auVar100,auVar42,SUB6416(ZEXT464(0x40000000),0));
                    fVar145 = auVar42._0_4_ * auVar80._0_4_;
                    auVar65 = vcvtdq2ps_avx(auVar89);
                    auVar10 = vcvtdq2ps_avx(auVar10);
                    auVar89 = vrcpps_avx(local_920);
                    auVar91._8_4_ = 0x3f800000;
                    auVar91._0_8_ = 0x3f8000003f800000;
                    auVar91._12_4_ = 0x3f800000;
                    auVar91._16_4_ = 0x3f800000;
                    auVar91._20_4_ = 0x3f800000;
                    auVar91._24_4_ = 0x3f800000;
                    auVar91._28_4_ = 0x3f800000;
                    auVar42 = vfnmadd213ps_fma(local_920,auVar89,auVar91);
                    auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar89,auVar89);
                    auVar70._8_4_ = 0x219392ef;
                    auVar70._0_8_ = 0x219392ef219392ef;
                    auVar70._12_4_ = 0x219392ef;
                    auVar70._16_4_ = 0x219392ef;
                    auVar70._20_4_ = 0x219392ef;
                    auVar70._24_4_ = 0x219392ef;
                    auVar70._28_4_ = 0x219392ef;
                    auVar89 = vcmpps_avx(local_9e0,auVar70,5);
                    auVar89 = vandps_avx(ZEXT1632(auVar42),auVar89);
                    auVar21._4_4_ =
                         (fVar157 * auVar65._4_4_ + local_960._4_4_) * fVar143 * auVar89._4_4_;
                    auVar21._0_4_ =
                         (fVar152 * auVar65._0_4_ + local_960._0_4_) * fVar143 * auVar89._0_4_;
                    auVar21._8_4_ =
                         (fVar158 * auVar65._8_4_ + local_960._8_4_) * fVar143 * auVar89._8_4_;
                    auVar21._12_4_ =
                         (fVar159 * auVar65._12_4_ + local_960._12_4_) * fVar143 * auVar89._12_4_;
                    auVar21._16_4_ =
                         (auVar65._16_4_ * 0.0 + local_960._16_4_) * fVar143 * auVar89._16_4_;
                    auVar21._20_4_ =
                         (auVar65._20_4_ * 0.0 + local_960._20_4_) * fVar143 * auVar89._20_4_;
                    auVar21._24_4_ =
                         (auVar65._24_4_ * 0.0 + local_960._24_4_) * fVar143 * auVar89._24_4_;
                    auVar21._28_4_ = auVar65._28_4_ + local_960._28_4_;
                    local_8c0 = vminps_avx(auVar21,auVar91);
                    auVar22._4_4_ =
                         (fVar157 * auVar10._4_4_ + local_940._4_4_) * fVar145 * auVar89._4_4_;
                    auVar22._0_4_ =
                         (fVar152 * auVar10._0_4_ + local_940._0_4_) * fVar145 * auVar89._0_4_;
                    auVar22._8_4_ =
                         (fVar158 * auVar10._8_4_ + local_940._8_4_) * fVar145 * auVar89._8_4_;
                    auVar22._12_4_ =
                         (fVar159 * auVar10._12_4_ + local_940._12_4_) * fVar145 * auVar89._12_4_;
                    auVar22._16_4_ =
                         (auVar10._16_4_ * 0.0 + local_940._16_4_) * fVar145 * auVar89._16_4_;
                    auVar22._20_4_ =
                         (auVar10._20_4_ * 0.0 + local_940._20_4_) * fVar145 * auVar89._20_4_;
                    auVar22._24_4_ =
                         (auVar10._24_4_ * 0.0 + local_940._24_4_) * fVar145 * auVar89._24_4_;
                    auVar22._28_4_ = local_8c0._28_4_;
                    local_8a0 = vminps_avx(auVar22,auVar91);
                    uVar26 = vmovmskps_avx(local_8e0);
                    if (uVar26 != 0) {
                      uVar25 = CONCAT44(0,uVar26 & 0xff);
                      local_ce0._0_8_ = uVar25;
                      lVar34 = 0;
                      for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                        lVar34 = lVar34 + 1;
                      }
                      local_b60._0_8_ = local_d28->user;
                      local_c40._0_8_ = pRVar30;
                      local_b80._0_16_ = auVar2;
                      local_c60._0_8_ = pGVar35;
                      do {
                        local_c14 = *(undefined4 *)(local_8c0 + lVar34 * 4);
                        local_c10 = *(undefined4 *)(local_8a0 + lVar34 * 4);
                        local_d30->tfar = *(float *)(local_880 + lVar34 * 4);
                        local_c20 = *(undefined4 *)(local_860 + lVar34 * 4);
                        local_c1c = *(undefined4 *)(local_840 + lVar34 * 4);
                        local_d00._0_8_ = lVar34;
                        local_c18 = *(undefined4 *)(local_820 + lVar34 * 4);
                        local_c0c = (undefined4)local_ca0;
                        local_c08 = (undefined4)local_d08;
                        local_c04 = *(uint *)local_b60._0_8_;
                        local_c00 = *(uint *)(local_b60._0_8_ + 4);
                        local_d14 = -1;
                        local_bf0.valid = &local_d14;
                        local_bf0.geometryUserPtr = pGVar35->userPtr;
                        local_bf0.context = (RTCRayQueryContext *)local_b60._0_8_;
                        local_bf0.ray = (RTCRayN *)local_d30;
                        local_bf0.hit = (RTCHitN *)&local_c20;
                        local_bf0.N = 1;
                        if (pGVar35->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_004c4c08:
                          if ((pRVar30->filter == (RTCFilterFunctionN)0x0) ||
                             (((pRVar30->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                               RTC_RAY_QUERY_FLAG_INCOHERENT &&
                              ((*(byte *)(local_c60._0_8_ + 0x3e) & 0x40) == 0))))
                          goto LAB_004c4d5a;
                          (*pRVar30->filter)(&local_bf0);
                          if (*local_bf0.valid != 0) goto LAB_004c4d5a;
                        }
                        else {
                          (*pGVar35->occlusionFilterN)(&local_bf0);
                          pRVar30 = (RTCIntersectArguments *)local_c40._0_8_;
                          if (*local_bf0.valid != 0) goto LAB_004c4c08;
                        }
                        local_d30->tfar = (float)local_b80._0_4_;
                        uVar36 = local_ce0._0_8_ ^ 1L << (local_d00._0_8_ & 0x3f);
                        local_ce0._0_8_ = uVar36;
                        lVar34 = 0;
                        for (uVar25 = uVar36; (uVar25 & 1) == 0;
                            uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                          lVar34 = lVar34 + 1;
                        }
                        pRVar30 = (RTCIntersectArguments *)local_c40._0_8_;
                        pGVar35 = (Geometry *)local_c60._0_8_;
                      } while (uVar36 != 0);
                    }
                  }
                }
              }
              uVar23 = local_c78 - 1 & local_c78;
              ray = local_d30;
              uVar25 = local_ca8;
              uVar36 = local_cb0;
            } while (uVar23 != 0);
          }
          auVar171 = ZEXT1664(local_b00);
          auVar162 = ZEXT1664(local_ae0);
          auVar156 = ZEXT1664(local_ad0);
          auVar136 = ZEXT1664(local_ab0);
          auVar132 = ZEXT1664(local_aa0);
          auVar121 = ZEXT1664(local_a90);
          auVar108 = ZEXT1664(local_b30);
          auVar97 = ZEXT1664(local_b20);
          auVar115 = ZEXT1664(local_b10);
          local_c90 = local_c90 + 1;
          auVar71._0_4_ = local_ac0;
          fVar143 = fStack_abc;
          fVar145 = fStack_ab8;
          fVar147 = fStack_ab4;
          auVar61._0_4_ = local_af0;
          fVar165 = fStack_aec;
          fVar166 = fStack_ae8;
          fVar167 = fStack_ae4;
        } while (local_c90 != local_c88);
      }
LAB_004c4d42:
    } while (local_c80 != &local_800);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }